

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O0

fiobj_type_enum fiobj_type(FIOBJ o)

{
  FIOBJ o_local;
  
  if (o == 0) {
    o_local._7_1_ = FIOBJ_T_NULL;
  }
  else if ((o & 1) == 0) {
    if ((o & 6) == 6) {
      o_local._7_1_ = (fiobj_type_enum)o;
    }
    else if ((o & 6) == 2) {
      o_local._7_1_ = FIOBJ_T_STRING;
    }
    else if ((o & 6) == 4) {
      o_local._7_1_ = FIOBJ_T_HASH;
    }
    else {
      o_local._7_1_ = *(fiobj_type_enum *)(o & 0xfffffffffffffff8);
    }
  }
  else {
    o_local._7_1_ = FIOBJ_T_NUMBER;
  }
  return o_local._7_1_;
}

Assistant:

FIO_INLINE fiobj_type_enum fiobj_type(FIOBJ o) {
  if (!o)
    return FIOBJ_T_NULL;
  if (o & FIOBJECT_NUMBER_FLAG)
    return FIOBJ_T_NUMBER;
  if ((o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_PRIMITIVE_FLAG)
    return (fiobj_type_enum)o;
  if (FIOBJECT_STRING_FLAG &&
      (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_STRING_FLAG)
    return FIOBJ_T_STRING;
  if (FIOBJECT_HASH_FLAG && (o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_HASH_FLAG)
    return FIOBJ_T_HASH;
  return ((fiobj_type_enum *)FIOBJ2PTR(o))[0];
}